

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O0

void Runner_run_case(Runner *runner,Arguments *args,Env *env)

{
  Dimensions dims_00;
  Dimensions dims_01;
  Dimensions dims_02;
  Dimensions dims_03;
  Dimensions dims_04;
  Dimensions dims_05;
  Dimensions dims_06;
  Dimensions dims_07;
  Dimensions dims_08;
  Dimensions dims_09;
  Dimensions dims_10;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  Bool_t BVar11;
  size_t sVar12;
  P *pPVar13;
  long lVar14;
  size_t sVar15;
  P *vo_00;
  P PVar16;
  Timer TVar17;
  Timer TVar18;
  double dVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined8 in_stack_fffffffffffffbc0;
  double local_430;
  Pointer *local_3c8;
  Pointer *local_3b8;
  Timer t2;
  Timer t1;
  int niterations;
  int iteration;
  Pointer vo;
  Pointer vi;
  Sweeper sweeper;
  Quantities quan;
  Dimensions dims;
  Dimensions dims_g;
  Env *env_local;
  Arguments *args_local;
  Runner *runner_local;
  
  Sweeper_null();
  Pointer_null();
  Pointer_null();
  PVar16 = P_zero();
  runner->normsq = PVar16;
  PVar16 = P_zero();
  runner->normsqdiff = PVar16;
  runner->time = 0.0;
  runner->flops = 0.0;
  runner->floprate = 0.0;
  runner->normsq = 0.0;
  runner->normsqdiff = 0.0;
  iVar1 = Arguments_consume_int_or_default(args,"--ncell_x",5);
  iVar2 = Arguments_consume_int_or_default(args,"--ncell_y",5);
  iVar3 = Arguments_consume_int_or_default(args,"--ncell_z",5);
  iVar4 = Arguments_consume_int_or_default(args,"--ne",0x1e);
  iVar5 = Arguments_consume_int_or_default(args,"--na",0x21);
  iVar6 = Arguments_consume_int_or_default(args,"--niterations",1);
  if (iVar1 < 1) {
    insist_("dims_g.ncell_x > 0 ? \"Invalid ncell_x supplied.\" : 0",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/4_driver/runner.c"
            ,0x58);
  }
  if (iVar2 < 1) {
    insist_("dims_g.ncell_y > 0 ? \"Invalid ncell_y supplied.\" : 0",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/4_driver/runner.c"
            ,0x59);
  }
  if (iVar3 < 1) {
    insist_("dims_g.ncell_z > 0 ? \"Invalid ncell_z supplied.\" : 0",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/4_driver/runner.c"
            ,0x5a);
  }
  if (iVar4 < 1) {
    insist_("dims_g.ne > 0 ? \"Invalid ne supplied.\" : 0",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/4_driver/runner.c"
            ,0x5b);
  }
  if (iVar5 < 1) {
    insist_("dims_g.na > 0 ? \"Invalid na supplied.\" : 0",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/4_driver/runner.c"
            ,0x5d);
  }
  if (iVar6 < 0) {
    insist_("niterations >= 0 ? \"Invalid iteration count supplied.\" : 0",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/4_driver/runner.c"
            ,0x5e);
  }
  dims_09.ne = iVar4;
  dims_09.ncell_z = iVar3;
  dims_09.na = iVar5;
  dims_09.nm = 0x10;
  iVar7 = Env_proc_x_this(env);
  iVar8 = Env_nproc_x(env);
  iVar9 = Env_proc_x_this(env);
  iVar10 = Env_nproc_x(env);
  iVar1 = ((iVar7 + 1) * iVar1) / iVar8 - (iVar9 * iVar1) / iVar10;
  iVar7 = Env_proc_y_this(env);
  iVar8 = Env_nproc_y(env);
  iVar9 = Env_proc_y_this(env);
  iVar10 = Env_nproc_y(env);
  iVar2 = ((iVar7 + 1) * iVar2) / iVar8 - (iVar9 * iVar2) / iVar10;
  dims_00.ncell_z = iVar3;
  dims_00.ne = iVar4;
  dims_00.ncell_x = iVar1;
  dims_00.ncell_y = iVar2;
  dims_00.nm = 0x10;
  dims_00.na = iVar5;
  Quantities_create((Quantities *)&sweeper.faces.noctant_per_block,dims_00,env);
  dims_01.ncell_z = iVar3;
  dims_01.ne = iVar4;
  dims_01.ncell_x = iVar1;
  dims_01.ncell_y = iVar2;
  dims_01.nm = 0x10;
  dims_01.na = iVar5;
  sVar12 = Dimensions_size_state(dims_01,4);
  BVar11 = Env_cuda_is_using_device(env);
  Pointer_create((Pointer *)&vo.is_alias_,sVar12,BVar11);
  Pointer_set_pinned((Pointer *)&vo.is_alias_,1);
  Pointer_allocate((Pointer *)&vo.is_alias_);
  dims_02.ncell_z = iVar3;
  dims_02.ne = iVar4;
  dims_02.ncell_x = iVar1;
  dims_02.ncell_y = iVar2;
  dims_02.nm = 0x10;
  dims_02.na = iVar5;
  sVar12 = Dimensions_size_state(dims_02,4);
  BVar11 = Env_cuda_is_using_device(env);
  Pointer_create((Pointer *)&niterations,sVar12,BVar11);
  Pointer_set_pinned((Pointer *)&niterations,1);
  Pointer_allocate((Pointer *)&niterations);
  pPVar13 = Pointer_h((Pointer *)&vo.is_alias_);
  dims_03.ncell_z = iVar3;
  dims_03.ne = iVar4;
  dims_03.ncell_x = iVar1;
  dims_03.ncell_y = iVar2;
  dims_03.nm = 0x10;
  dims_03.na = iVar5;
  initialize_state(pPVar13,dims_03,4,(Quantities *)&sweeper.faces.noctant_per_block);
  pPVar13 = Pointer_h((Pointer *)&niterations);
  dims_04.ncell_z = iVar3;
  dims_04.ne = iVar4;
  dims_04.ncell_x = iVar1;
  dims_04.ncell_y = iVar2;
  dims_04.nm = 0x10;
  dims_04.na = iVar5;
  initialize_state_zero(pPVar13,dims_04,4);
  dims_05.ncell_z = iVar3;
  dims_05.ne = iVar4;
  dims_05.ncell_x = iVar1;
  dims_05.ncell_y = iVar2;
  dims_05.nm = 0x10;
  dims_05.na = iVar5;
  Sweeper_create((Sweeper *)&vi.is_alias_,dims_05,(Quantities *)&sweeper.faces.noctant_per_block,env
                 ,args);
  BVar11 = Arguments_are_all_consumed(args);
  if (BVar11 == 0) {
    insist_("Arguments_are_all_consumed( args ) ? \"Invalid argument detected.\" : 0",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/4_driver/runner.c"
            ,0x8e);
  }
  TVar17 = Env_get_synced_time(env);
  for (t1._4_4_ = 0; t1._4_4_ < iVar6; t1._4_4_ = t1._4_4_ + 1) {
    if (t1._4_4_ % 2 == 0) {
      local_3b8 = (Pointer *)&niterations;
    }
    else {
      local_3b8 = (Pointer *)&vo.is_alias_;
    }
    if (t1._4_4_ % 2 == 0) {
      local_3c8 = (Pointer *)&vo.is_alias_;
    }
    else {
      local_3c8 = (Pointer *)&niterations;
    }
    Sweeper_sweep((Sweeper *)&vi.is_alias_,local_3b8,local_3c8,
                  (Quantities *)&sweeper.faces.noctant_per_block,env);
  }
  TVar18 = Env_get_synced_time(env);
  runner->time = TVar18 - TVar17;
  dims_06.ncell_z = iVar3;
  dims_06.ne = iVar4;
  dims_06.ncell_x = iVar1;
  dims_06.ncell_y = iVar2;
  dims_06.nm = 0x10;
  dims_06.na = iVar5;
  sVar12 = Dimensions_size_state(dims_06,4);
  lVar14 = sVar12 << 3;
  auVar21._8_4_ = (int)((ulong)lVar14 >> 0x20);
  auVar21._0_8_ = lVar14;
  auVar21._12_4_ = 0x45300000;
  dVar19 = (auVar21._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar14) - 4503599627370496.0);
  dims_07.ncell_z = iVar3;
  dims_07.ne = iVar4;
  dims_07.ncell_x = iVar1;
  dims_07.ncell_y = iVar2;
  dims_07.nm = 0x10;
  dims_07.na = iVar5;
  sVar12 = Dimensions_size_state_angles(dims_07,4);
  auVar22._8_4_ = (int)(sVar12 >> 0x20);
  auVar22._0_8_ = sVar12;
  auVar22._12_4_ = 0x45300000;
  dims_10.ncell_z = 0x10;
  dims_10.ne = iVar5;
  dims_10.ncell_x = iVar3;
  dims_10.ncell_y = iVar4;
  dims_10.nm = (int)in_stack_fffffffffffffbc0;
  dims_10.na = (int)((ulong)in_stack_fffffffffffffbc0 >> 0x20);
  dVar20 = Quantities_flops_per_solve(dims_10);
  dims_08.ncell_z = iVar3;
  dims_08.ne = iVar4;
  dims_08.ncell_x = iVar1;
  dims_08.ncell_y = iVar2;
  dims_08.nm = 0x10;
  dims_08.na = iVar5;
  sVar15 = Dimensions_size_state(dims_08,4);
  lVar14 = sVar15 << 3;
  auVar23._8_4_ = (int)((ulong)lVar14 >> 0x20);
  auVar23._0_8_ = lVar14;
  auVar23._12_4_ = 0x45300000;
  dVar19 = Env_sum_d(env,(double)iVar6 *
                         (((auVar23._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)lVar14) - 4503599627370496.0)) * 2.0 *
                          (double)iVar5 +
                         (dVar19 + dVar19) * (double)iVar5 +
                         ((auVar22._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)sVar12) - 4503599627370496.0)) * dVar20))
  ;
  runner->flops = dVar19;
  if (0.0 < runner->time) {
    local_430 = (runner->flops / runner->time) / 1000000000.0;
  }
  else {
    local_430 = 0.0;
  }
  runner->floprate = local_430;
  pPVar13 = Pointer_h((Pointer *)&vo.is_alias_);
  vo_00 = Pointer_h((Pointer *)&niterations);
  dims_09.ncell_x = iVar1;
  dims_09.ncell_y = iVar2;
  get_state_norms(pPVar13,vo_00,dims_09,4,&runner->normsq,&runner->normsqdiff,env);
  Pointer_destroy((Pointer *)&vo.is_alias_);
  Pointer_destroy((Pointer *)&niterations);
  Sweeper_destroy((Sweeper *)&vi.is_alias_,env);
  Quantities_destroy((Quantities *)&sweeper.faces.noctant_per_block);
  return;
}

Assistant:

void Runner_run_case( Runner* runner, Arguments* args, Env* env )
{
  /*---Declarations---*/

  Dimensions  dims_g;       /*---dims for entire problem---*/
  Dimensions  dims;         /*---dims for the part on this MPI proc---*/
  Quantities  quan;
  Sweeper     sweeper = Sweeper_null();

  Pointer vi = Pointer_null();
  Pointer vo = Pointer_null();

  runner->normsq     = P_zero();
  runner->normsqdiff = P_zero();

  int iteration   = 0;
  int niterations = 0;

  Timer t1             = 0;
  Timer t2             = 0;

  runner->time       = 0;
  runner->flops      = 0;
  runner->floprate   = 0;
  runner->normsq     = 0;
  runner->normsqdiff = 0;

  /*---Define problem specs---*/

  dims_g.ncell_x = Arguments_consume_int_or_default( args, "--ncell_x",  5 );
  dims_g.ncell_y = Arguments_consume_int_or_default( args, "--ncell_y",  5 );
  dims_g.ncell_z = Arguments_consume_int_or_default( args, "--ncell_z",  5 );
  dims_g.ne   = Arguments_consume_int_or_default( args, "--ne", 30 );
  dims_g.na   = Arguments_consume_int_or_default( args, "--na", 33 );
  niterations = Arguments_consume_int_or_default( args, "--niterations", 1 );
  dims_g.nm   = NM;

  Insist( dims_g.ncell_x > 0 ? "Invalid ncell_x supplied." : 0 );
  Insist( dims_g.ncell_y > 0 ? "Invalid ncell_y supplied." : 0 );
  Insist( dims_g.ncell_z > 0 ? "Invalid ncell_z supplied." : 0 );
  Insist( dims_g.ne > 0      ? "Invalid ne supplied." : 0 );
  Insist( dims_g.nm > 0      ? "Invalid nm supplied." : 0 );
  Insist( dims_g.na > 0      ? "Invalid na supplied." : 0 );
  Insist( niterations >= 0   ? "Invalid iteration count supplied." : 0 );

  /*---Initialize (local) dimensions - domain decomposition---*/

  dims = dims_g;

  dims.ncell_x =
      ( ( Env_proc_x_this( env ) + 1 ) * dims_g.ncell_x ) / Env_nproc_x( env )
    - ( ( Env_proc_x_this( env )     ) * dims_g.ncell_x ) / Env_nproc_x( env );

  dims.ncell_y =
      ( ( Env_proc_y_this( env ) + 1 ) * dims_g.ncell_y ) / Env_nproc_y( env )
    - ( ( Env_proc_y_this( env )     ) * dims_g.ncell_y ) / Env_nproc_y( env );

  /*---Initialize quantities---*/

  Quantities_create( &quan, dims, env );

  /*---Allocate arrays---*/

  Pointer_create( &vi, Dimensions_size_state( dims, NU ),
                                            Env_cuda_is_using_device( env ) );
  Pointer_set_pinned( &vi, Bool_true );
  Pointer_allocate( &vi );

  Pointer_create( &vo, Dimensions_size_state( dims, NU ),
                                            Env_cuda_is_using_device( env ) );
  Pointer_set_pinned( &vo, Bool_true );
  Pointer_allocate( &vo );

  /*---Initialize input state array---*/

  initialize_state( Pointer_h( &vi ), dims, NU, &quan );

  /*---Initialize output state array---*/
  /*---This is not strictly required for the output vector but might
       have a performance effect from pre-touching pages.
  ---*/

  initialize_state_zero( Pointer_h( &vo ), dims, NU );

  /*---Initialize sweeper---*/

  Sweeper_create( &sweeper, dims, &quan, env, args );

  /*---Check that all command line args used---*/

  Insist( Arguments_are_all_consumed( args )
                                          ? "Invalid argument detected." : 0 );

  /*---Call sweeper---*/

  t1 = Env_get_synced_time( env );

  for( iteration=0; iteration<niterations; ++iteration )
  {
    Sweeper_sweep( &sweeper,
                   iteration%2==0 ? &vo : &vi,
                   iteration%2==0 ? &vi : &vo,
                   &quan,
                   env );
  }

  t2 = Env_get_synced_time( env );
  runner->time = t2 - t1;

  /*---Compute flops used---*/

  runner->flops = Env_sum_d( env, niterations *
         ( Dimensions_size_state( dims, NU ) * NOCTANT * 2. * dims.na
         + Dimensions_size_state_angles( dims, NU )
                                        * Quantities_flops_per_solve( dims )
         + Dimensions_size_state( dims, NU ) * NOCTANT * 2. * dims.na ) );

  runner->floprate = runner->time <= (Timer)0 ?
                                   0 : runner->flops / runner->time / 1e9;

  /*---Compute, print norm squared of result---*/

  get_state_norms( Pointer_h( &vi ), Pointer_h( &vo ),
                     dims, NU, &runner->normsq, &runner->normsqdiff, env );

  /*---Deallocations---*/
  Pointer_destroy( &vi );
  Pointer_destroy( &vo );

  Sweeper_destroy( &sweeper, env );
  Quantities_destroy( &quan );
}